

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

double __thiscall
NEST::LArNEST::GetERElectronYields(LArNEST *this,double energy,double efield,double density)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double doke_birks;
  double gamma;
  double beta;
  double alpha;
  double density_local;
  double efield_local;
  double energy_local;
  LArNEST *this_local;
  
  dVar3 = GetERElectronYieldsAlpha(this,efield,density);
  dVar4 = GetERElectronYieldsBeta(this,efield);
  dVar5 = GetERElectronYieldsGamma(this,efield);
  dVar6 = GetERElectronYieldsDokeBirks(this,efield);
  dVar1 = (this->fER).p1;
  dVar2 = (this->fER).p2;
  dVar7 = pow(energy + 0.5,(this->fER).p3);
  dVar7 = pow(dVar2 * dVar7 + dVar1,(this->fER).p4);
  dVar1 = (this->fER).delta;
  dVar2 = (this->fER).p5;
  dVar8 = pow(energy,(this->fER).let);
  return dVar3 * dVar4 + (-dVar3 * dVar4 + dVar5) / dVar7 + dVar1 / (dVar6 * dVar8 + dVar2);
}

Assistant:

double LArNEST::GetERElectronYields(double energy, double efield,
                                    double density) {
  double alpha = GetERElectronYieldsAlpha(efield, density);
  double beta = GetERElectronYieldsBeta(efield);
  double gamma = GetERElectronYieldsGamma(efield);
  double doke_birks = GetERElectronYieldsDokeBirks(efield);
  return alpha * beta +
         (gamma - alpha * beta) /
             pow(fER.p1 + fER.p2 * pow(energy + 0.5, fER.p3), fER.p4) +
         fER.delta / (fER.p5 + doke_birks * pow(energy, fER.let));
}